

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O2

void __thiscall ClipperLib::clipperException::~clipperException(clipperException *this)

{
  *(undefined ***)this = &PTR__clipperException_007f00c8;
  std::__cxx11::string::~string((string *)&this->m_descr);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~clipperException() throw() {}